

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

void fiobj_data_pre_write(FIOBJ o,uintptr_t length)

{
  void *pvVar1;
  int *piVar2;
  uintptr_t length_local;
  FIOBJ o_local;
  
  if (*(int *)(o + 0x30) == -2) {
    fiobj_data_copy_parent(o);
  }
  else if ((*(int *)(o + 0x30) == -1) && (*(code **)(o + 0x10) != fio_free)) {
    fiobj_data_copy_buffer(o);
  }
  if (*(ulong *)(o + 0x18) < *(long *)(o + 0x20) + length) {
    *(uintptr_t *)(o + 0x18) = ((*(long *)(o + 0x20) + length >> 0xc) + 1) * 0x1000;
    pvVar1 = fio_realloc(*(void **)(o + 8),*(size_t *)(o + 0x18));
    *(void **)(o + 8) = pvVar1;
    if (*(long *)(o + 8) == 0) {
      perror("FATAL ERROR: fiobj IO couldn\'t allocate memory");
      piVar2 = __errno_location();
      exit(*piVar2);
    }
  }
  return;
}

Assistant:

static inline void fiobj_data_pre_write(FIOBJ o, uintptr_t length) {
  switch (obj2io(o)->fd) {
  case -1:
    if (obj2io(o)->source.dealloc != fio_free) {
      fiobj_data_copy_buffer(o);
    }
    break;
  case -2:
    fiobj_data_copy_parent(o);
    break;
  }
  if (obj2io(o)->capa >= obj2io(o)->len + length)
    return;
  /* add rounded pages (4096) to capacity */
  obj2io(o)->capa = (((obj2io(o)->len + length) >> 12) + 1) << 12;
  obj2io(o)->buffer = fio_realloc(obj2io(o)->buffer, obj2io(o)->capa);
  REQUIRE_MEM(obj2io(o)->buffer);
}